

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

int32_t ucnv_extMatchFromU(int32_t *cx,UChar32 firstCP,UChar *pre,int32_t preLength,UChar *src,
                          int32_t srcLength,uint32_t *pMatchValue,UBool useFallback,UBool flush)

{
  ushort uVar1;
  UChar UVar2;
  int iVar3;
  int iVar4;
  uint32_t value;
  ulong uVar5;
  long lVar6;
  UBool UVar7;
  int iVar8;
  uint uVar9;
  UChar *pUVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int32_t limit;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint local_6c;
  int local_68;
  
  local_68 = 0;
  if (((cx != (int32_t *)0x0) && (firstCP >> 10 < cx[0xb])) &&
     (uVar9 = *(uint *)((long)cx +
                       (ulong)*(ushort *)
                               ((long)cx +
                               (ulong)((firstCP & 0xfU) +
                                      (uint)*(ushort *)
                                             ((long)cx +
                                             (ulong)(((uint)firstCP >> 4 & 0x3f) +
                                                    (uint)*(ushort *)
                                                           ((long)cx +
                                                           (long)(firstCP >> 10) * 2 + (long)cx[10])
                                                    ) * 2 + (long)cx[10]) * 4) * 2 + (long)cx[0xd])
                       * 4 + (long)cx[0xf]), local_68 = 0, uVar9 != 0)) {
    if (uVar9 < 0x1f0000) {
      iVar3 = cx[5];
      iVar4 = cx[6];
      local_6c = 0;
      iVar16 = 0;
      iVar15 = 0;
      local_68 = 0;
      do {
        uVar11 = (ulong)uVar9;
        uVar1 = *(ushort *)((long)cx + uVar11 * 2 + (long)iVar3);
        value = *(uint32_t *)((long)cx + uVar11 * 4 + (long)iVar4);
        if ((value != 0) && (UVar7 = extFromUUseMapping(useFallback,value,firstCP), UVar7 != '\0'))
        {
          local_68 = iVar16 + iVar15 + 2;
          local_6c = value;
        }
        if (iVar16 < preLength) {
          pUVar10 = pre;
          iVar8 = iVar16;
          iVar16 = iVar16 + 1;
        }
        else {
          if (srcLength <= iVar15) {
            if ((flush == '\0') && (iVar15 + iVar16 < 0x14)) {
              return -2 - (iVar15 + iVar16);
            }
            goto LAB_002f6f12;
          }
          pUVar10 = src;
          iVar8 = iVar15;
          iVar15 = iVar15 + 1;
        }
        lVar6 = uVar11 * 2 + 2 + (long)iVar3;
        UVar2 = pUVar10[iVar8];
        uVar13 = 0;
        uVar9 = (uint)uVar1;
        while( true ) {
          uVar14 = uVar9;
          uVar12 = (uint)uVar13;
          uVar9 = uVar12;
          if ((int)(uVar14 - uVar12) < 2) break;
          if (uVar14 - uVar12 < 5) {
            if ((((ushort)*(UChar *)((long)cx + (long)(int)uVar12 * 2 + lVar6) < (ushort)UVar2) &&
                ((uVar9 = uVar12 + 1, (int)uVar14 <= (int)uVar9 ||
                 ((ushort)*(UChar *)((long)cx + (long)(int)uVar9 * 2 + lVar6) < (ushort)UVar2)))) &&
               ((uVar9 = uVar12 + 2, (int)uVar14 <= (int)uVar9 ||
                ((ushort)*(UChar *)((long)cx + (long)(int)uVar9 * 2 + lVar6) < (ushort)UVar2)))) {
              uVar9 = uVar12 + 3;
            }
            break;
          }
          uVar5 = (long)(int)(uVar14 + uVar12) / 2;
          uVar9 = (uint)uVar5;
          if ((ushort)*(UChar *)((long)cx + (long)(int)uVar9 * 2 + lVar6) <= (ushort)UVar2) {
            uVar13 = uVar5 & 0xffffffff;
            uVar9 = uVar14;
          }
        }
        if ((((int)uVar14 <= (int)uVar9) || ((int)uVar9 < 0)) ||
           (*(UChar *)((long)cx + (long)(int)uVar9 * 2 + lVar6) != UVar2)) goto LAB_002f6f12;
        uVar9 = *(uint *)((long)cx + (ulong)uVar9 * 4 + uVar11 * 4 + (long)iVar4 + 4);
      } while (uVar9 < 0x1000000);
      UVar7 = extFromUUseMapping(useFallback,uVar9,firstCP);
      if (UVar7 != '\0') {
        local_68 = iVar16 + iVar15 + 2;
        local_6c = uVar9;
      }
LAB_002f6f12:
      uVar9 = local_6c;
      if (local_68 == 0) {
        return 0;
      }
    }
    else {
      UVar7 = extFromUUseMapping(useFallback,uVar9,firstCP);
      if (UVar7 == '\0') {
        return 0;
      }
      local_68 = 2;
    }
    if (uVar9 == 0x80000001) {
      local_68 = 1;
    }
    else {
      *pMatchValue = uVar9;
    }
  }
  return local_68;
}

Assistant:

static int32_t
ucnv_extMatchFromU(const int32_t *cx,
                   UChar32 firstCP,
                   const UChar *pre, int32_t preLength,
                   const UChar *src, int32_t srcLength,
                   uint32_t *pMatchValue,
                   UBool useFallback, UBool flush) {
    const uint16_t *stage12, *stage3;
    const uint32_t *stage3b;

    const UChar *fromUTableUChars, *fromUSectionUChars;
    const uint32_t *fromUTableValues, *fromUSectionValues;

    uint32_t value, matchValue;
    int32_t i, j, idx, length, matchLength;
    UChar c;

    if(cx==NULL) {
        return 0; /* no extension data, no match */
    }

    /* trie lookup of firstCP */
    idx=firstCP>>10; /* stage 1 index */
    if(idx>=cx[UCNV_EXT_FROM_U_STAGE_1_LENGTH]) {
        return 0; /* the first code point is outside the trie */
    }

    stage12=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_12_INDEX, uint16_t);
    stage3=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3_INDEX, uint16_t);
    idx=UCNV_EXT_FROM_U(stage12, stage3, idx, firstCP);

    stage3b=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3B_INDEX, uint32_t);
    value=stage3b[idx];
    if(value==0) {
        return 0;
    }

    /*
     * Tests for (value&UCNV_EXT_FROM_U_RESERVED_MASK)==0:
     * Do not interpret values with reserved bits used, for forward compatibility,
     * and do not even remember intermediate results with reserved bits used.
     */

    if(UCNV_EXT_TO_U_IS_PARTIAL(value)) {
        /* partial match, enter the loop below */
        idx=(int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value);

        /* initialize */
        fromUTableUChars=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_UCHARS_INDEX, UChar);
        fromUTableValues=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_VALUES_INDEX, uint32_t);

        matchValue=0;
        i=j=matchLength=0;

        /* we must not remember fallback matches when not using fallbacks */

        /* match input units until there is a full match or the input is consumed */
        for(;;) {
            /* go to the next section */
            fromUSectionUChars=fromUTableUChars+idx;
            fromUSectionValues=fromUTableValues+idx;

            /* read first pair of the section */
            length=*fromUSectionUChars++;
            value=*fromUSectionValues++;
            if(value!=0 && extFromUUseMapping(useFallback, value, firstCP)) {
                /* remember longest match so far */
                matchValue=value;
                matchLength=2+i+j;
            }

            /* match pre[] then src[] */
            if(i<preLength) {
                c=pre[i++];
            } else if(j<srcLength) {
                c=src[j++];
            } else {
                /* all input consumed, partial match */
                if(flush || (length=(i+j))>UCNV_EXT_MAX_UCHARS) {
                    /*
                     * end of the entire input stream, stop with the longest match so far
                     * or: partial match must not be longer than UCNV_EXT_MAX_UCHARS
                     * because it must fit into state buffers
                     */
                    break;
                } else {
                    /* continue with more input next time */
                    return -(2+length);
                }
            }

            /* search for the current UChar */
            idx=ucnv_extFindFromU(fromUSectionUChars, length, c);
            if(idx<0) {
                /* no match here, stop with the longest match so far */
                break;
            } else {
                value=fromUSectionValues[idx];
                if(UCNV_EXT_FROM_U_IS_PARTIAL(value)) {
                    /* partial match, continue */
                    idx=(int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value);
                } else {
                    if(extFromUUseMapping(useFallback, value, firstCP)) {
                        /* full match, stop with result */
                        matchValue=value;
                        matchLength=2+i+j;
                    } else {
                        /* full match on fallback not taken, stop with the longest match so far */
                    }
                    break;
                }
            }
        }

        if(matchLength==0) {
            /* no match at all */
            return 0;
        }
    } else /* result from firstCP trie lookup */ {
        if(extFromUUseMapping(useFallback, value, firstCP)) {
            /* full match, stop with result */
            matchValue=value;
            matchLength=2;
        } else {
            /* fallback not taken */
            return 0;
        }
    }

    /* return result */
    if(matchValue==UCNV_EXT_FROM_U_SUBCHAR1) {
        return 1; /* assert matchLength==2 */
    }

    *pMatchValue=matchValue;
    return matchLength;
}